

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  int *piVar2;
  Base BVar3;
  Base BVar4;
  Base BVar5;
  Base BVar6;
  Base BVar7;
  char *__s1;
  int iVar8;
  Base *pBVar9;
  Base *dest;
  Base *dest_00;
  uint uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  DNASlice slc2;
  DNASlice slc;
  DNASlice foo;
  DNASlice local_60;
  DNASlice local_50;
  DNASlice local_40;
  
  if (argc == 2) {
    __s1 = argv[1];
    iVar8 = strcmp(__s1,"test");
    if (iVar8 != 0) {
      iVar8 = strcmp(__s1,"show");
      if (iVar8 == 0) {
        DNASlice::DNASlice(&local_50,"aggctca");
        printf("Created DNA slice: ");
        DNA::print(local_50._dna,local_50._size);
        putc(10,_stdout);
        printf("Created a DNA view: ");
        DNA::print(local_50._dna,local_50._size - 2);
        putc(10,_stdout);
        if (local_50._dna != (Base *)0x0) {
          operator_delete__(local_50._dna);
        }
      }
      return 0;
    }
  }
  else {
    main_cold_1();
  }
  pBVar9 = (Base *)operator_new__(0x28);
  DNA::fromCStr(pBVar9,10,"AATG");
  printf("Got the DNA ");
  DNA::print(pBVar9,10);
  puts(" .");
  BVar3 = *pBVar9;
  BVar4 = pBVar9[1];
  BVar5 = pBVar9[2];
  BVar6 = pBVar9[3];
  operator_delete__(pBVar9);
  dest = (Base *)operator_new__(0x28);
  dest_00 = (Base *)operator_new__(0x10);
  DNA::fromCStr(dest,10,"AATTGGCCAA");
  DNA::fromCStr(dest_00,4,"CCAA");
  lVar12 = 0;
  bVar14 = false;
  pBVar9 = dest_00;
  do {
    if (bVar14) {
      if (pBVar9 == dest_00 + 4) {
        uVar11 = 0;
        goto LAB_001015d0;
      }
      BVar7 = *pBVar9;
      pBVar9 = pBVar9 + 1;
      if (BVar7 != *(Base *)((long)dest + lVar12)) {
        pBVar9 = dest_00;
        bVar14 = false;
      }
    }
    else {
      bVar13 = *pBVar9 == *(Base *)((long)dest + lVar12);
      if (bVar13) {
        bVar14 = true;
      }
      pBVar9 = pBVar9 + bVar13;
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x28);
  uVar11 = (uint)(pBVar9 != dest_00 + 4);
LAB_001015d0:
  operator_delete__(dest);
  operator_delete__(dest_00);
  DNASlice::DNASlice(&local_50,"AGCCT");
  DNASlice::DNASlice(&local_60,"ACGTT");
  DNASlice::DNASlice(&local_40,"ACGTT");
  if (local_40._size == local_60._size) {
    uVar10 = (uint)(local_40._size == 0);
    if (local_40._size != 0) {
      if (*local_40._dna == *local_60._dna) {
        lVar12 = 4;
        do {
          bVar14 = local_40._size << 2 == lVar12;
          uVar10 = (uint)bVar14;
          if (bVar14) goto LAB_0010165e;
          piVar1 = (int *)((long)local_40._dna + lVar12);
          piVar2 = (int *)((long)local_60._dna + lVar12);
          lVar12 = lVar12 + 4;
        } while (*piVar1 == *piVar2);
      }
      goto LAB_0010165c;
    }
  }
  else {
LAB_0010165c:
    uVar10 = 0;
  }
LAB_0010165e:
  if (local_50._size == local_60._size) {
    bVar14 = local_50._size == 0;
    if (bVar14) goto LAB_001016a5;
    if (*local_50._dna == *local_60._dna) {
      lVar12 = 4;
      do {
        bVar14 = local_50._size << 2 == lVar12;
        if (bVar14) goto LAB_001016a5;
        piVar1 = (int *)((long)local_50._dna + lVar12);
        piVar2 = (int *)((long)local_60._dna + lVar12);
        lVar12 = lVar12 + 4;
      } while (*piVar1 == *piVar2);
    }
  }
  bVar14 = false;
LAB_001016a5:
  if (local_40._dna != (Base *)0x0) {
    operator_delete__(local_40._dna);
  }
  if (local_60._dna != (Base *)0x0) {
    operator_delete__(local_60._dna);
  }
  if (local_50._dna != (Base *)0x0) {
    operator_delete__(local_50._dna);
  }
  printf("Got %u failures\n");
  exit((uint)((uint)bVar14 +
              (uVar10 ^ 1) +
              (uint)(BVar6 != G) + (uint)(BVar5 != T) + uVar11 +
              (((BVar3 != A) + 1) - (uint)(BVar4 == A)) != 0) * 3);
}

Assistant:

int main(int argc, char const* argv[]) {
	if (argc != 2) {
		std::fprintf(stderr, "Must specify mode, got %d args\n", argc);
		std::exit(2);
	}
	
	if (std::strcmp(argv[1], "test") == 0) {
		gTester.clear();
		testfromCStr();
		testContains();
		testDNASlice();
		gTester.finish();
	}
	
	if (std::strcmp(argv[1], "show") == 0) {
		DNASlice s1("aggctca");
		std::printf("Created DNA slice: ");
		s1.print();
		std::putc('\n', stdout);
		DNAView v1(s1.dna(), s1.size() - 2);
		std::printf("Created a DNA view: ");
		DNA::print(v1.dna(), v1.size());
		std::putc('\n', stdout);
		
	}
	return 0;
}